

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetDefaultLocalizedGMT
          (TimeZoneFormat *this,UnicodeString *text,int start,int32_t *parsedLen)

{
  int8_t iVar1;
  int iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t local_60;
  int32_t offsetAbut;
  int32_t lenAbut;
  int32_t offsetWithSep;
  int32_t lenWithSep;
  int32_t iStack_4c;
  UChar c;
  int32_t sign;
  int32_t len;
  UChar *gmt;
  int local_38;
  int32_t i;
  int32_t gmtLen;
  int32_t parsed;
  int32_t offset;
  int32_t idx;
  int32_t *parsedLen_local;
  UnicodeString *pUStack_18;
  int start_local;
  UnicodeString *text_local;
  TimeZoneFormat *this_local;
  
  gmtLen = 0;
  i = 0;
  local_38 = 0;
  gmt._4_4_ = 0;
  parsed = start;
  _offset = parsedLen;
  parsedLen_local._4_4_ = start;
  pUStack_18 = text;
  text_local = (UnicodeString *)this;
  while (*(short *)(ALT_GMT_STRINGS + (long)gmt._4_4_ * 8) != 0) {
    _sign = (UChar *)(ALT_GMT_STRINGS + (long)gmt._4_4_ * 8);
    iStack_4c = u_strlen_63(_sign);
    iVar1 = icu_63::UnicodeString::caseCompare(pUStack_18,parsedLen_local._4_4_,iStack_4c,_sign,0);
    if (iVar1 == '\0') {
      local_38 = iStack_4c;
      break;
    }
    gmt._4_4_ = gmt._4_4_ + 1;
  }
  if (local_38 != 0) {
    parsed = local_38 + parsed;
    iVar2 = parsed + 1;
    iVar3 = icu_63::UnicodeString::length(pUStack_18);
    if (iVar2 < iVar3) {
      lenWithSep = 1;
      offsetWithSep._2_2_ = icu_63::UnicodeString::charAt(pUStack_18,parsed);
      if (offsetWithSep._2_2_ == L'+') {
        lenWithSep = 1;
      }
      else {
        if (offsetWithSep._2_2_ != L'-') goto LAB_002f1ce5;
        lenWithSep = -1;
      }
      parsed = parsed + 1;
      lenAbut = 0;
      offsetAbut = parseDefaultOffsetFields(this,pUStack_18,parsed,L':',&lenAbut);
      iVar3 = lenAbut;
      iVar4 = icu_63::UnicodeString::length(pUStack_18);
      if (iVar3 == iVar4 - parsed) {
        gmtLen = offsetAbut * lenWithSep;
        parsed = lenAbut + parsed;
      }
      else {
        local_60 = 0;
        iVar2 = parseAbuttingOffsetFields(this,pUStack_18,parsed,&local_60);
        if (local_60 < lenAbut) {
          iVar2 = offsetAbut;
          local_60 = lenAbut;
        }
        parsed = local_60 + parsed;
        gmtLen = iVar2 * lenWithSep;
      }
      i = parsed - parsedLen_local._4_4_;
    }
  }
LAB_002f1ce5:
  *_offset = i;
  return gmtLen;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetDefaultLocalizedGMT(const UnicodeString& text, int start, int32_t& parsedLen) const {
    int32_t idx = start;
    int32_t offset = 0;
    int32_t parsed = 0;

    do {
        // check global default GMT alternatives
        int32_t gmtLen = 0;

        for (int32_t i = 0; ALT_GMT_STRINGS[i][0] != 0; i++) {
            const UChar* gmt = ALT_GMT_STRINGS[i];
            int32_t len = u_strlen(gmt);
            if (text.caseCompare(start, len, gmt, 0) == 0) {
                gmtLen = len;
                break;
            }
        }
        if (gmtLen == 0) {
            break;
        }
        idx += gmtLen;

        // offset needs a sign char and a digit at minimum
        if (idx + 1 >= text.length()) {
            break;
        }

        // parse sign
        int32_t sign = 1;
        UChar c = text.charAt(idx);
        if (c == PLUS) {
            sign = 1;
        } else if (c == MINUS) {
            sign = -1;
        } else {
            break;
        }
        idx++;

        // offset part
        // try the default pattern with the separator first
        int32_t lenWithSep = 0;
        int32_t offsetWithSep = parseDefaultOffsetFields(text, idx, DEFAULT_GMT_OFFSET_SEP, lenWithSep);
        if (lenWithSep == text.length() - idx) {
            // maximum match
            offset = offsetWithSep * sign;
            idx += lenWithSep;
        } else {
            // try abutting field pattern
            int32_t lenAbut = 0;
            int32_t offsetAbut = parseAbuttingOffsetFields(text, idx, lenAbut);

            if (lenWithSep > lenAbut) {
                offset = offsetWithSep * sign;
                idx += lenWithSep;
            } else {
                offset = offsetAbut * sign;
                idx += lenAbut;
            }
        }
        parsed = idx - start;
    } while (false);

    parsedLen = parsed;
    return offset;
}